

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O3

void SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(int *colVals,int *rowPtr,int *consP,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int k_1;
  int iVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int k;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined8 extraout_XMM0_Qb;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  GpuArray<double,_9U> conc;
  Real h_RT [9];
  Real c_R [9];
  Real dcRdT [9];
  double dStack_740;
  double local_708 [10];
  double local_6b8;
  double local_6a8;
  double local_698;
  double adStack_690 [21];
  double local_5e8;
  double local_5d8;
  undefined8 uStack_5d0;
  double local_5c8;
  double local_5b8;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double dStack_590;
  double local_588;
  double dStack_580;
  double local_578;
  double dStack_570;
  undefined8 local_568;
  double local_558;
  double dStack_550;
  double local_548;
  double dStack_540;
  double local_538;
  double local_530;
  double local_528;
  undefined8 uStack_520;
  double local_518;
  undefined8 uStack_510;
  double local_508;
  undefined8 uStack_500;
  double local_4f8;
  undefined8 uStack_4f0;
  double local_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d8 [16];
  double local_4c8;
  undefined8 uStack_4c0;
  double local_4b8;
  double dStack_4b0;
  double local_4a8;
  double dStack_4a0;
  double dStack_498;
  double local_490;
  double local_488;
  double local_480 [2];
  double adStack_470 [84];
  undefined1 auStack_1d0 [16];
  double local_1c0;
  double dStack_1b8;
  double local_1b0;
  double local_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  double local_160;
  double local_158 [10];
  double local_108 [10];
  double local_b8;
  double dStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78 [9];
  
  adStack_690[7] = 0.0;
  adStack_690[8] = 0.0;
  adStack_690[5] = 0.0;
  adStack_690[6] = 0.0;
  adStack_690[3] = 0.0;
  adStack_690[4] = 0.0;
  adStack_690[1] = 0.0;
  adStack_690[2] = 0.0;
  adStack_690[9] = 0.0;
  lVar7 = 1;
  auVar24 = _DAT_0065b9a0;
  do {
    if (SUB164(auVar24 ^ _DAT_0065b9b0,4) == -0x80000000 &&
        SUB164(auVar24 ^ _DAT_0065b9b0,0) < -0x7ffffff7) {
      adStack_690[lVar7] = 0.1111111111111111;
      adStack_690[lVar7 + 1] = 0.1111111111111111;
    }
    lVar10 = auVar24._8_8_;
    auVar24._0_8_ = auVar24._0_8_ + 2;
    auVar24._8_8_ = lVar10 + 2;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 0xb);
  iVar6 = *consP;
  pdVar8 = &local_4b8;
  lVar7 = 0;
  memset(pdVar8,0,800);
  dVar25 = adStack_690[4];
  dVar23 = adStack_690[3];
  local_708[6] = 0.0;
  local_708[7] = 0.0;
  local_708[4] = 0.0;
  local_708[5] = 0.0;
  local_708[2] = 0.0;
  local_708[3] = 0.0;
  local_708[0] = 0.0;
  local_708[1] = 0.0;
  local_708[8] = 0.0;
  dVar38 = 0.0;
  do {
    dVar38 = dVar38 + adStack_690[lVar7 + 1];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 9);
  local_5a8 = 2.911342024497792;
  dStack_5a0 = 3.254512984911126;
  local_598 = -15.528347679998124;
  dStack_590 = 19.481084666666668;
  local_588 = 22.009669090999374;
  dStack_580 = 5.94295186894925;
  local_578 = 5.3818731557687505;
  dStack_570 = -5.101694818407498;
  local_568 = 0x4008a2a8a3a0d57d;
  local_698 = adStack_690[1];
  local_5d8 = adStack_690[2];
  uStack_5d0 = 0;
  dVar22 = adStack_690[2] * adStack_690[4];
  dVar13 = (((adStack_690[3] * 10.0 +
             adStack_690[2] * -0.21999999999999997 + dVar38 + adStack_690[1]) * 1e-12) /
           118698922.25997423) * 1838773899538452.5;
  local_6b8 = log10(dVar13);
  local_6a8 = exp(-1.5e+33);
  local_6a8 = local_6a8 * 0.19999999999999996;
  local_5b8 = local_6a8 + 0.8;
  local_548 = log10(local_5b8);
  local_558 = local_548 * -1.27 + 0.75;
  local_5e8 = local_548 * -0.67 + -0.4 + local_6b8;
  local_6b8 = 1.0 / (local_5e8 * -0.14 + local_558);
  local_5e8 = local_5e8 * local_6b8;
  local_5c8 = 1.0 / (local_5e8 * local_5e8 + 1.0);
  dVar14 = pow(10.0,local_548 * local_5c8);
  dVar15 = (local_548 + local_548) * local_5c8 * local_5c8 * local_5e8 * local_6b8;
  dVar47 = -local_558 * dVar15 * local_6b8;
  dVar14 = dVar14 * (dVar13 / (dVar13 + 1.0));
  dVar44 = (dVar22 * 118698922.25997423 + adStack_690[7] * -11503468.582662737) * dVar14;
  dVar46 = 0.0 - dVar44;
  local_708[1] = dVar46;
  local_708[3] = dVar46;
  local_708[6] = dVar44 + 0.0;
  lVar7 = 0;
  adStack_690[0xb] = 0.0;
  adStack_690[0xc] = dVar14 * 118698922.25997423 * dVar25 + 0.0;
  adStack_690[0xd] = 0.0;
  adStack_690[0xe] = dVar14 * 118698922.25997423 * local_5d8 + 0.0;
  adStack_690[0xf] = 0.0;
  adStack_690[0x10] = 0.0;
  adStack_690[0x11] = dVar14 * -11503468.582662737 + 0.0;
  adStack_690[0x12] = 0.0;
  adStack_690[0x13] = 0.0;
  pdVar9 = &dStack_4b0;
  do {
    dVar16 = adStack_690[lVar7 + 0xb];
    *pdVar9 = *pdVar9 - dVar16;
    pdVar9[2] = pdVar9[2] - dVar16;
    pdVar9[5] = dVar16 + pdVar9[5];
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 10;
  } while (lVar7 != 9);
  dVar15 = dVar14 * (dVar22 * 47479.56890398969 + adStack_690[7] * -130017.75806443932) +
           (dVar47 * -0.0006207345732258481 +
            (dVar15 * local_5e8 * -1.27 + dVar47 * -0.67 + local_5c8) *
            (local_6a8 / -1e-30 + -8e-31) * (0.43429448190325176 / local_5b8) +
           -0.0006207345732258481 / (dVar13 + 1.0)) * 2.302585092994046 * dVar44;
  pdVar9 = local_480;
  adStack_470[0x52] = adStack_470[0x52] - dVar15;
  auStack_1d0._0_8_ = (double)auStack_1d0._0_8_ - dVar15;
  dStack_1b8 = dVar15 + dStack_1b8;
  dVar14 = dVar23 * 11.0 + local_698 * 1.5 + dVar38;
  dVar15 = ((dVar14 * 1e-06) / 25936106.98548031) * 28231227327.532616;
  local_6a8 = adStack_690[8];
  local_5b8 = -0.0002845931413337665 / (dVar15 + 1.0);
  local_5c8 = log10(dVar15);
  local_6b8 = exp(-1.5e+33);
  local_6b8 = local_6b8 * 0.5;
  local_5e8 = local_6b8 + 0.5;
  local_4c8 = log10(local_5e8);
  dVar38 = local_4c8 * -1.27 + 0.75;
  local_4d8._8_4_ = (int)extraout_XMM0_Qb;
  local_4d8._0_8_ = dVar38;
  local_4d8._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  local_548 = local_4c8 * -0.67 + -0.4 + local_5c8;
  local_5c8 = 1.0 / (local_548 * -0.14 + dVar38);
  local_548 = local_548 * local_5c8;
  local_558 = 1.0 / (local_548 * local_548 + 1.0);
  dVar38 = pow(10.0,local_4c8 * local_558);
  dVar13 = (local_4c8 + local_4c8) * local_558 * local_558 * local_548 * local_5c8;
  local_5c8 = -(double)local_4d8._0_8_ * dVar13 * local_5c8;
  dVar38 = dVar38 * (dVar15 / (dVar15 + 1.0));
  dVar15 = (local_6a8 * 25936106.98548031 + adStack_690[6] * adStack_690[6] * -3419315.29664768) *
           dVar38;
  local_708[5] = dVar15 + dVar15 + local_708[5];
  local_708[7] = local_708[7] - dVar15;
  adStack_690[0xb] = 0.0;
  adStack_690[0xc] = 0.0;
  adStack_690[0xd] = 0.0;
  adStack_690[0xe] = 0.0;
  lVar7 = 0;
  adStack_690[0xf] = 0.0;
  adStack_690[0x10] = dVar38 * 3419315.29664768 * -2.0 * adStack_690[6] + 0.0;
  adStack_690[0x11] = 0.0;
  adStack_690[0x12] = dVar38 * 25936106.98548031 + 0.0;
  adStack_690[0x13] = 0.0;
  do {
    dVar44 = adStack_690[lVar7 + 0xb];
    pdVar9[-2] = dVar44 + dVar44 + pdVar9[-2];
    *pdVar9 = *pdVar9 - dVar44;
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 10;
  } while (lVar7 != 9);
  dVar38 = dVar38 * (local_6a8 * 280925.8837546357 +
                    adStack_690[6] * adStack_690[6] * -591.7471466541167) +
           (local_5c8 * -0.0002845931413337665 +
            (dVar13 * local_548 * -1.27 + local_5c8 * -0.67 + local_558) *
            (local_6b8 / -1e-30 + -4.9999999999999995e-31) * (0.43429448190325176 / local_5e8) +
           local_5b8) * 2.302585092994046 * dVar15;
  local_1c0 = dVar38 + dVar38 + local_1c0;
  local_1b0 = local_1b0 - dVar38;
  adStack_690[0xc] = local_698 * 1.0145869685785861e-06 + dVar25 * dVar25 * -407.1662961015109;
  dVar38 = dVar14 * adStack_690[0xc];
  local_708[0] = local_708[0] - dVar38;
  local_708[3] = dVar38 + dVar38 + dVar46;
  adStack_690[0xb] = adStack_690[0xc] * 2.5 + dVar14 * 1.0145869685785861e-06;
  adStack_690[0xd] = adStack_690[0xc] * 12.0;
  adStack_690[0xe] = dVar14 * 407.1662961015109 * -2.0 * dVar25 + adStack_690[0xc];
  adStack_690[0xf] = adStack_690[0xc];
  adStack_690[0x12] = adStack_690[0xc];
  adStack_690[0x13] = adStack_690[0xc];
  adStack_690[0x10] = adStack_690[0xc];
  adStack_690[0x11] = adStack_690[0xc];
  lVar7 = 0;
  do {
    dVar38 = adStack_690[lVar7 + 0xb];
    *pdVar8 = *pdVar8 - dVar38;
    pdVar8[3] = dVar38 + dVar38 + pdVar8[3];
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 10;
  } while (lVar7 != 9);
  dVar38 = (local_698 * 2.2738361995042403e-08 +
           ((((dStack_590 + dStack_590) - local_5a8) + -1.0) * -0.0006666666666666666 +
           0.022411446922976298) * -407.1662961015109 * dVar25 * dVar25) * dVar14;
  pdVar8 = &dStack_4b0;
  adStack_470[0x51] = adStack_470[0x51] - dVar38;
  auStack_1d0._0_8_ = dVar38 + dVar38 + (double)auStack_1d0._0_8_;
  adStack_690[0xe] =
       adStack_690[5] * adStack_690[5] * 159.17961552912485 + local_5d8 * -2.0846475553480232e-08;
  dVar38 = dVar14 * adStack_690[0xe];
  local_708[1] = dVar46 + dVar38;
  adStack_690[0xb] = adStack_690[0xe] * 2.5;
  adStack_690[0xc] = dVar14 * -2.0846475553480232e-08 + adStack_690[0xe];
  adStack_690[0xd] = adStack_690[0xe] * 12.0;
  adStack_690[0xf] =
       (dVar14 * 159.17961552912485 + dVar14 * 159.17961552912485) * adStack_690[5] +
       adStack_690[0xe];
  adStack_690[0x12] = adStack_690[0xe];
  adStack_690[0x13] = adStack_690[0xe];
  adStack_690[0x10] = adStack_690[0xe];
  adStack_690[0x11] = adStack_690[0xe];
  lVar7 = 0;
  do {
    dVar15 = adStack_690[lVar7 + 0xb];
    *pdVar8 = *pdVar8 + dVar15;
    pdVar8[3] = pdVar8[3] - (dVar15 + dVar15);
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 10;
  } while (lVar7 != 9);
  dVar13 = (adStack_690[5] * adStack_690[5] * -0.05305987184304161 +
           (((dStack_5a0 - (local_588 + local_588)) + 1.0) * -0.0006666666666666666 +
           -0.0003333333333333333) * -2.0846475553480232e-08 * local_5d8) * dVar14;
  pdVar8 = &local_490;
  dVar15 = adStack_470[0x52] + dVar13;
  adStack_470[0x52] = dVar15;
  auStack_1d0._8_8_ = (double)auStack_1d0._8_8_ - (dVar13 + dVar13);
  adStack_690[0xc] =
       adStack_690[5] * dVar25 * 3142.6666666666665 + adStack_690[6] * -5.646680545093694e-06;
  dVar13 = dVar14 * adStack_690[0xc];
  local_708[3] = local_708[3] - dVar13;
  local_708[4] = (local_708[4] - (dVar38 + dVar38)) - dVar13;
  local_708[5] = dVar13 + local_708[5];
  adStack_690[0xb] = adStack_690[0xc] * 2.5;
  adStack_690[0xd] = adStack_690[0xc] * 12.0;
  adStack_690[0xe] = adStack_690[0xc] + adStack_690[5] * dVar14 * 3142.6666666666665;
  adStack_690[0xf] = adStack_690[0xc] + dVar25 * dVar14 * 3142.6666666666665;
  adStack_690[0x10] = dVar14 * -5.646680545093694e-06 + adStack_690[0xc];
  adStack_690[0x11] = adStack_690[0xc];
  adStack_690[0x12] = adStack_690[0xc];
  adStack_690[0x13] = adStack_690[0xc];
  lVar7 = 0;
  do {
    dVar13 = adStack_690[lVar7 + 0xb];
    pdVar8[-2] = pdVar8[-2] - dVar13;
    pdVar8[-1] = pdVar8[-1] - dVar13;
    *pdVar8 = dVar13 + *pdVar8;
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 10;
  } while (lVar7 != 9);
  dVar13 = (adStack_690[5] * dVar25 * -2.095111111111111 +
           (((5.94295186894925 - (dStack_590 + local_588)) + 1.0) * -0.0006666666666666666 +
           -0.0006666666666666666) * -5.646680545093694e-06 * adStack_690[6]) * dVar14;
  pdVar8 = &local_4a8;
  auVar1._8_4_ = SUB84((double)auStack_1d0._8_8_ - dVar13,0);
  auVar1._0_8_ = (double)auStack_1d0._0_8_ - dVar13;
  auVar1._12_4_ = (int)((ulong)((double)auStack_1d0._8_8_ - dVar13) >> 0x20);
  auStack_1d0 = auVar1;
  local_1c0 = dVar13 + local_1c0;
  dVar13 = dVar25 * adStack_690[6];
  adStack_690[0xc] = dVar13 * 16888.888888888887 + dVar23 * -1.4321870058604512e-06;
  dVar44 = dVar14 * adStack_690[0xc];
  local_708[2] = local_708[2] + dVar44;
  adStack_690[0xb] = adStack_690[0xc] * 2.5;
  adStack_690[0xd] = dVar14 * -1.4321870058604512e-06 + adStack_690[0xc] * 12.0;
  adStack_690[0xe] = adStack_690[0xc] + adStack_690[6] * dVar14 * 16888.888888888887;
  adStack_690[0xf] = adStack_690[0xc];
  adStack_690[0x10] = dVar14 * 16888.888888888887 * dVar25 + adStack_690[0xc];
  adStack_690[0x11] = adStack_690[0xc];
  adStack_690[0x12] = adStack_690[0xc];
  adStack_690[0x13] = adStack_690[0xc];
  lVar7 = 0;
  do {
    dVar47 = adStack_690[lVar7 + 0xb];
    *pdVar8 = *pdVar8 + dVar47;
    pdVar8[1] = pdVar8[1] - dVar47;
    pdVar8[3] = pdVar8[3] - dVar47;
    lVar7 = lVar7 + 1;
    pdVar8 = pdVar8 + 10;
  } while (lVar7 != 9);
  dVar14 = dVar14 * (dVar13 * -22.518518518518515 +
                    (((local_598 - (dStack_590 + 5.94295186894925)) + 1.0) * -0.0006666666666666666
                    + -0.0013333333333333333) * -1.4321870058604512e-06 * dVar23);
  dVar64 = dVar22 * 694956.7634748495 + adStack_690[6] * adStack_690[5] * -9534710.169227276;
  dVar23 = dVar22 * 2391.8538305613447 +
           (0.0034417304158633542 -
           ((local_588 + 5.94295186894925) - (dStack_5a0 + dStack_590)) * 0.0006666666666666666) *
           -9534710.169227276 * adStack_690[6] * adStack_690[5];
  dVar25 = dVar25 * 694956.7634748495;
  dVar45 = adStack_690[5] * -9534710.169227276;
  dVar48 = adStack_690[5] * 1860366.9115799016;
  dStack_498 = dStack_498 - dVar48;
  dVar26 = adStack_690[6] * -1341454.8115373214;
  local_5d8 = local_5d8 * 694956.7634748495;
  adStack_470[0x19] = (local_5d8 + adStack_470[0x19]) - dVar26;
  dVar58 = adStack_690[1] * 1860366.9115799016;
  dVar60 = adStack_690[6] * -9534710.169227276;
  adStack_470[0x1f] = adStack_470[0x1f] - dVar58;
  adStack_470[0x22] = (adStack_470[0x22] - dVar60) + dVar58;
  dVar55 = adStack_690[6] * 4271828.084344627;
  local_4a8 = dVar55 + local_4a8;
  local_490 = (dVar48 + local_490) - dVar55;
  dVar27 = adStack_690[3] * -145376.75098299314;
  dVar49 = adStack_690[4] * -1341454.8115373214;
  dVar28 = adStack_690[4] * -145376.75098299314;
  dVar35 = adStack_690[5] * 86324.17110758815;
  adStack_470[0xb] = adStack_470[0xb] - dVar28;
  dVar59 = adStack_690[1] * 4271828.084344627;
  adStack_470[0x29] = (adStack_470[0x29] - dVar49) - dVar59;
  adStack_470[0xf] = adStack_470[0xf] - dVar35;
  dVar16 = adStack_690[3] * 86324.17110758815;
  adStack_470[0x21] = adStack_470[0x21] - dVar16;
  dVar17 = adStack_690[6] * -3658126.0115307234;
  dVar22 = adStack_690[1] * adStack_690[6];
  dVar47 = adStack_690[1] * adStack_690[5];
  auVar2._8_4_ = SUB84(dVar47,0);
  auVar2._0_8_ = dVar22;
  auVar2._12_4_ = (int)((ulong)dVar47 >> 0x20);
  dVar39 = dVar22 * 7577.3366907946565 +
           (0.0017737925172045287 -
           ((dStack_590 + local_598) - (dStack_580 + local_5a8)) * 0.0006666666666666666) *
           -145376.75098299314 * adStack_690[4] * adStack_690[3];
  dStack_550 = dVar47 * 5928.561733942619 +
               (0.0031867701457385282 -
               ((dStack_580 + dStack_590) - (local_588 + local_5a8)) * 0.0006666666666666666) *
               -1341454.8115373214 * dVar13;
  dVar18 = adStack_690[2] * -0.32384379658070717;
  dStack_4b0 = dVar18 + dStack_4b0;
  dVar19 = adStack_690[7] * 12595057.621245861;
  adStack_470[0x16] = dVar19 + (adStack_470[0x16] - local_5d8);
  dVar29 = adStack_690[4] * 12595057.621245861;
  dVar57 = adStack_690[7] * 64119709.90701692;
  uStack_4c0 = 0;
  dVar30 = adStack_690[6] * -0.6025543492746578;
  dVar52 = adStack_690[6] * -32.62001221218423;
  dVar54 = adStack_690[2] * -0.6025543492746578;
  adStack_470[5] = (dVar25 + adStack_470[5]) - dVar30;
  dVar62 = adStack_690[7] * 32500000.0;
  adStack_470[0x20] = (adStack_470[0x20] - dVar60) + dVar62;
  local_b8 = (((adStack_470[0x2d] + dVar45) - dVar49) - dVar17) - dVar54;
  dVar65 = adStack_690[4] * 64119709.90701692;
  dVar66 = adStack_690[5] * 32500000.0;
  dVar63 = adStack_690[7] * adStack_690[4];
  dVar20 = dVar63 * 12595057.621245861 + adStack_690[1] * adStack_690[2] * -0.32384379658070717;
  dVar21 = dVar63 * 2318.3152480739177 +
           (0.00018406547375879315 -
           ((local_5a8 + dStack_5a0) - (dStack_590 + local_578)) * 0.0006666666666666666) *
           -0.32384379658070717 * adStack_690[1] * adStack_690[2];
  local_4c8 = dVar21 + ((adStack_470[0x51] - dStack_550) - dVar39);
  dVar31 = dVar63 * 4230.445091721601 +
           (6.597729618328551e-05 -
           ((dStack_580 + dStack_580) - (dStack_590 + local_578)) * 0.0006666666666666666) *
           -16.310006106092114 * adStack_690[6] * adStack_690[6];
  dVar36 = adStack_690[5] * adStack_690[7] * 0.0 +
           (0.0 - ((dStack_580 + dStack_5a0) - (local_578 + local_588)) * 0.0006666666666666666) *
           -0.6025543492746578 * adStack_690[6] * adStack_690[2];
  dVar50 = adStack_690[7] * adStack_690[6] * 34143562.115192875 +
           adStack_690[2] * adStack_690[3] * -0.029876205886692417;
  dVar40 = adStack_690[3] * -0.029876205886692417;
  dVar42 = adStack_690[1] * -0.32384379658070717;
  dVar51 = adStack_690[7] * adStack_690[6] * -3795.2266287524203 +
           (-0.00011115497017997593 -
           ((dStack_5a0 + local_598) - (dStack_580 + local_578)) * 0.0006666666666666666) *
           -0.029876205886692417 * adStack_690[2] * adStack_690[3];
  adStack_470[1] = dVar42 + adStack_470[1];
  adStack_470[3] = adStack_470[3] + dVar40;
  adStack_470[4] = (adStack_470[4] - dVar25) - dVar42;
  adStack_470[6] = (dVar25 + adStack_470[6] + dVar30) - dVar40;
  dVar32 = adStack_690[2] * -0.029876205886692417;
  adStack_470[0xc] = adStack_470[0xc] + dVar32;
  dVar41 = adStack_690[7] * 15085094.926858293;
  dVar33 = adStack_690[7] * 34143562.115192875;
  local_198 = ((adStack_470[0x2f] - dVar52) - dVar54) - dVar33;
  adStack_470[0x2a] = (adStack_470[0x2a] - dVar45) + dVar54 + dVar33;
  dVar47 = adStack_690[6] * 34143562.115192875;
  dVar43 = adStack_690[7] * adStack_690[7];
  dStack_740 = auVar2._8_8_;
  dVar34 = dVar22 * 4271828.084344627 + adStack_690[4] * adStack_690[3] * -145376.75098299314;
  dVar37 = dStack_740 * 1860366.9115799016 + dVar13 * -1341454.8115373214;
  dVar67 = adStack_690[8] * adStack_690[2];
  dVar13 = dVar63 * 64119709.90701692 + adStack_690[6] * adStack_690[6] * -16.310006106092114;
  local_4d8._8_8_ =
       adStack_690[5] * adStack_690[7] * 32500000.0 +
       adStack_690[6] * adStack_690[2] * -0.6025543492746578;
  dVar56 = adStack_690[8] * -4.470666408692084;
  local_178 = adStack_690[1] * adStack_690[7];
  uStack_170 = 0;
  dVar63 = adStack_690[7] * -4323.663734083463;
  dStack_190 = adStack_690[6];
  local_88 = adStack_690[6];
  dStack_80 = adStack_690[8];
  dVar61 = adStack_690[8] * -150.1634478502138;
  dVar22 = adStack_690[2] * -150.1634478502138;
  dVar53 = dVar43 * 20212.492175153773 +
           (0.0026797964842987356 -
           ((dStack_5a0 + dStack_570) - (local_578 + local_578)) * 0.0006666666666666666) *
           -150.1634478502138 * dVar67;
  adStack_470[2] = dVar42 + (adStack_470[2] - dVar25) + dVar30 + dVar40 + dVar61 + dVar56;
  adStack_470[7] =
       ((((adStack_470[7] - dVar42) - dVar30) - dVar40) - (dVar61 + dVar61)) - (dVar56 + dVar56);
  adStack_470[8] = dVar56 + dVar61 + adStack_470[8];
  local_98 = adStack_690[5] * adStack_690[3] * 374.95779706744673 +
             (0.00434360147634811 -
             (dStack_580 * 2.0 + -(local_588 + local_598)) * 0.0006666666666666666) *
             -1829063.0057653617 * adStack_690[6] * adStack_690[6];
  dStack_90 = dVar43 * -81.82756742036453 +
              (-0.0003643959615980579 -
              (local_578 * -2.0 + dStack_5a0 + dStack_570) * 0.0006666666666666666) *
              -4.470666408692084 * dVar67;
  local_558 = dStack_90 * -2.0 +
              (((((dStack_1b8 - dVar21) - dVar31) - dVar36) - dVar51) - (dVar53 + dVar53));
  dVar56 = dVar43 * 7542547.463429146 + dVar67 * -150.1634478502138;
  dStack_540 = dVar51 + ((adStack_470[0x53] + dVar14 + dVar39) - local_98);
  local_548 = dVar53 + dVar21 + (dVar15 - dVar23) + dVar36 + dVar51;
  dVar61 = adStack_690[5] * adStack_690[3] * 86324.17110758815 +
           adStack_690[6] * adStack_690[6] * -1829063.0057653617;
  dVar67 = dVar43 * 224556.7351007675 + dVar67 * -4.470666408692084;
  dVar25 = dVar61 * 2.0 + ((dVar37 + (local_708[5] - dVar44) + dVar64) - dVar34);
  dVar15 = dVar67 * -2.0 +
           (((((local_708[6] - dVar20) - dVar13) - (double)local_4d8._8_8_) - dVar50) -
           (dVar56 + dVar56));
  auVar3._8_4_ = SUB84(dVar15,0);
  auVar3._0_8_ = dVar25;
  auVar3._12_4_ = (int)((ulong)dVar15 >> 0x20);
  local_708[6] = auVar3._8_8_;
  dVar15 = adStack_690[7] * 449113.470201535;
  adStack_470[0x34] = dVar29 + adStack_470[0x34] + dVar66 + dVar47 + dVar41 + dVar15;
  dVar30 = adStack_690[6] * -7.112730406981104e-05;
  adStack_470[0xe] = (adStack_470[0xe] + dVar28) - dVar30;
  dVar43 = adStack_690[8] * 6362141.693962547;
  adStack_470[0x17] = dVar27 + adStack_470[0x17] + dVar43;
  adStack_470[0x1a] = dVar57 + dVar57 + ((local_5d8 + adStack_470[0x1a] + dVar26) - dVar27) + dVar43
  ;
  local_4e8 = adStack_690[3];
  uStack_4e0 = 0;
  dVar40 = adStack_690[3] * -7.112730406981104e-05;
  adStack_470[0x2c] = (((adStack_470[0x2c] - dVar45) + dVar49 + dVar59) - dVar52) - dVar40;
  local_508 = adStack_690[4];
  uStack_500 = 0;
  adStack_690[2] = adStack_690[2] * -4.470666408692084;
  dVar42 = adStack_690[4] * 6362141.693962547;
  adStack_470[0x3e] = adStack_470[0x3e] + dVar22 + adStack_690[2];
  local_4b8 = dVar18 + ((local_4b8 - dVar48) - dVar55) + dVar63;
  dStack_4a0 = ((dVar55 + dStack_4a0 + dVar48) - dVar18) - dVar63;
  local_488 = (local_488 - dVar18) + dVar63;
  local_480[0] = local_480[0] - dVar63;
  local_a8 = adStack_690[8];
  uStack_a0 = 0;
  dVar18 = adStack_690[8] * 3347824.3674030215;
  adStack_470[0x15] = dVar19 + ((adStack_470[0x15] - dVar26) - dVar27) + dVar18;
  adStack_470[0x18] =
       ((((dVar27 + (adStack_470[0x18] - local_5d8) + dVar26) - dVar19) - dVar57) - dVar43) - dVar18
  ;
  adStack_470[0x1b] = dVar18 + ((adStack_470[0x1b] - dVar19) - dVar57);
  adStack_470[0x1c] = (adStack_470[0x1c] - dVar43) - dVar18;
  local_4f8 = local_5a8 + local_578;
  uStack_4f0 = 0;
  local_518 = dStack_570;
  uStack_510 = 0;
  local_528 = dStack_580;
  uStack_520 = 0;
  dVar18 = adStack_690[8] * 5672469.694980093;
  adStack_470[0x23] = ((((dVar60 + adStack_470[0x23]) - dVar58) - dVar16) - dVar62) - dVar18;
  adStack_470[0x24] = dVar18 + dVar16 + dVar16 + dVar58 + dVar60 + adStack_470[0x24] + dVar62;
  adStack_470[0x25] = dVar18 + (adStack_470[0x25] - dVar62);
  adStack_470[0x26] = adStack_470[0x26] - dVar18;
  adStack_690[1] = adStack_690[1] * -4323.663734083463;
  dVar16 = adStack_690[6] * -5282.492258864639;
  local_530 = adStack_470[0x30] - dVar40;
  adStack_470[0x33] = dVar29 + adStack_470[0x33] + adStack_690[1];
  adStack_470[0x36] = ((adStack_470[0x36] - dVar29) - dVar65) - adStack_690[1];
  adStack_470[0x37] = (adStack_470[0x37] - dVar66) - dVar16;
  dVar63 = adStack_690[4] * 3347824.3674030215;
  dVar26 = adStack_690[5] * 5672469.694980093;
  adStack_470[0x3d] = adStack_470[0x3d] + dVar63;
  dVar43 = adStack_690[5] * adStack_690[8] * 5672469.694980093 +
           adStack_690[7] * adStack_690[6] * -5282.492258864639;
  local_188 = adStack_690[5] * adStack_690[8] * 12599.866574880663 +
              (0.0022212311836643283 -
              ((local_578 + dStack_580) - (local_588 + dStack_570)) * 0.0006666666666666666) *
              -5282.492258864639 * adStack_690[7] * adStack_690[6];
  dStack_180 = adStack_690[5];
  local_4d8._0_8_ = (dVar13 + dVar13 + dVar25 + (double)local_4d8._8_8_) - dVar50;
  local_708[4] = ((((local_708[4] + dVar64) - dVar37) - dVar61) - (double)local_4d8._8_8_) - dVar43;
  adStack_470[0x40] = (adStack_470[0x40] - dVar42) - dVar63;
  adStack_470[0x41] = adStack_470[0x41] - dVar26;
  dVar48 = adStack_690[3] * -43.95116952269832;
  local_168 = (((dVar65 + dVar65 + adStack_470[0x38] + dVar66) - dVar47) + dVar16) - dVar48;
  local_160 = ((((((adStack_470[0x39] - dVar29) - dVar65) - dVar66) - dVar47) - (dVar41 + dVar41)) -
              (dVar15 + dVar15)) + adStack_690[1] + dVar16 + dVar48;
  local_538 = (((dVar15 + dVar41 + adStack_470[0x3a]) - adStack_690[1]) - dVar16) - dVar48;
  dVar19 = adStack_690[8] * 1000000.0;
  dVar15 = adStack_690[6] * 1000000.0;
  dVar16 = adStack_690[7] * -5282.492258864639;
  dVar18 = adStack_690[8] * 23496864.50220335;
  dStack_b0 = (((dVar52 + dVar52 +
                 dVar17 + dVar17 + ((dVar49 + dVar45 + adStack_470[0x2e]) - dVar59) + dVar54) -
               dVar33) + dVar40 + dVar16) - dVar19;
  dVar27 = adStack_690[7] * -1032.714674988212;
  dVar25 = adStack_690[7] * -43.95116952269832;
  adStack_470[0xd] = ((adStack_470[0xd] + dVar28) - dVar35) + dVar32 + dVar30 + dVar25 + dVar27;
  adStack_470[0x10] =
       ((((dVar35 + dVar35 + (adStack_470[0x10] - dVar28)) - dVar32) + dVar30) - dVar25) - dVar27;
  adStack_470[0x11] = dVar25 + (adStack_470[0x11] - dVar32) + dVar27;
  adStack_470[0x12] = ((adStack_470[0x12] - dVar30) - dVar25) - dVar27;
  adStack_470[0x2b] = ((adStack_470[0x2b] + dVar59) - dVar17) + dVar33 + dVar40 + dVar19 + dVar18;
  adStack_470[0x2d] = local_b8 - dVar16;
  adStack_470[0x2e] = dStack_b0 - dVar18;
  adStack_470[0x2f] = local_198 + dVar16 + dVar19 + dVar18;
  dVar25 = adStack_690[3] * -1032.714674988212;
  adStack_470[0x30] = (((adStack_470[0x30] - dVar40) - dVar16) - dVar19) - dVar18;
  adStack_470[0x35] = dVar47 + adStack_470[0x35] + dVar48 + dVar25;
  adStack_470[0x38] = local_168 - dVar25;
  adStack_470[0x39] = local_160 + dVar25;
  adStack_470[0x3a] = local_538 - dVar25;
  dVar25 = adStack_690[6] * 23496864.50220335;
  adStack_470[0x3f] = adStack_470[0x3f] + dVar42 + dVar15 + dVar25;
  adStack_470[0x42] = ((adStack_470[0x42] + dVar42 + dVar26) - dVar15) - dVar25;
  adStack_470[0x43] =
       ((adStack_470[0x43] - (dVar22 + dVar22)) - (adStack_690[2] + adStack_690[2])) + dVar63 +
       dVar26 + dVar15 + dVar25;
  adStack_470[0x44] =
       (((((dVar22 + adStack_470[0x44] + adStack_690[2]) - dVar42) - dVar63) - dVar26) - dVar15) -
       dVar25;
  adStack_690[7] = adStack_690[3] * adStack_690[7];
  dVar47 = adStack_690[6] * adStack_690[8] * 0.0 +
           (0.0 - ((local_578 + local_598) - (dStack_570 + dStack_580)) * 0.0006666666666666666) *
           -43.95116952269832 * adStack_690[7];
  dVar17 = adStack_690[8] * adStack_690[4] * 5648.9319335705395 +
           (0.0008878978503309949 -
           ((local_598 + dStack_580) - (dStack_570 + dStack_590)) * 0.0006666666666666666) *
           -7.112730406981104e-05 * adStack_690[6] * adStack_690[3];
  adStack_470[0x52] = dStack_90 + local_548;
  dVar22 = adStack_690[6] * adStack_690[8] * 50223.15555469926 +
           (0.0021374407444869816 -
           ((local_578 + local_598) - (dStack_580 + dStack_570)) * 0.0006666666666666666) *
           -1032.714674988212 * adStack_690[7];
  dVar15 = adStack_690[8] * adStack_690[4] * 5952.53958938735 +
           (0.0017780322191766774 -
           ((local_5a8 + local_578) - (dStack_570 + dStack_590)) * 0.0006666666666666666) *
           -4323.663734083463 * local_178;
  adStack_470[0x51] = local_4c8 + dVar15;
  dVar16 = adStack_690[6] * adStack_690[8] * 1000000.0 + adStack_690[7] * -43.95116952269832;
  dVar18 = adStack_690[8] * adStack_690[4] * 6362141.693962547 +
           adStack_690[6] * adStack_690[3] * -7.112730406981104e-05;
  local_708[1] = dVar20 + ((dVar46 + dVar38) - dVar64) + (double)local_4d8._8_8_ + dVar50 + dVar56 +
                 dVar67;
  dVar25 = dVar50 + ((local_708[2] + dVar34) - dVar61) + dVar18;
  auVar4._8_4_ = SUB84(dVar25,0);
  auVar4._0_8_ = local_708[1];
  auVar4._12_4_ = (int)((ulong)dVar25 >> 0x20);
  local_708[2] = auVar4._8_8_;
  dVar38 = adStack_690[6] * adStack_690[8] * 23496864.50220335 + adStack_690[7] * -1032.714674988212
  ;
  dVar46 = adStack_690[8] * adStack_690[4] * 3347824.3674030215 + local_178 * -4323.663734083463;
  local_708[0] = dVar20 + ((local_708[0] - dVar37) - dVar34) + dVar46;
  local_708[2] = local_708[2] + dVar16 + dVar38;
  dVar25 = ((((dVar34 + ((local_708[3] - dVar44) - dVar64) + dVar37) - dVar20) - dVar13) - dVar18) -
           dVar46;
  auVar5._8_4_ = SUB84(dVar25,0);
  auVar5._0_8_ = local_708[2];
  auVar5._12_4_ = (int)((ulong)dVar25 >> 0x20);
  local_708[3] = auVar5._8_8_;
  local_708[5] = (((double)local_4d8._0_8_ + dVar18 + dVar43) - dVar16) - dVar38;
  local_708[6] = local_708[6] + dVar46 + dVar43 + dVar16 + dVar38;
  local_708[7] = (((((dVar67 + local_708[7] + dVar56) - dVar18) - dVar46) - dVar43) - dVar16) -
                 dVar38;
  adStack_470[0x53] = dVar17 + dStack_540 + dVar47 + dVar22;
  auStack_1d0._8_8_ =
       (((((double)auStack_1d0._8_8_ + dVar23) - dStack_550) - local_98) - dVar36) - local_188;
  auStack_1d0._0_8_ =
       ((((dVar39 + (((double)auStack_1d0._0_8_ - dVar14) - dVar23) + dStack_550) - dVar21) - dVar31
        ) - dVar17) - dVar15;
  local_1c0 = ((((dVar31 + dVar31 +
                  local_98 * 2.0 + ((dStack_550 + dVar23 + (local_1c0 - dVar14)) - dVar39) + dVar36)
                - dVar51) + dVar17 + local_188) - dVar47) - dVar22;
  dStack_1b8 = local_558 + dVar15 + local_188 + dVar47 + dVar22;
  local_1b0 = (((((dStack_90 + local_1b0 + dVar53) - dVar17) - dVar15) - local_188) - dVar47) -
              dVar22;
  if (iVar6 == 0) {
    local_158[0] = 2.8916149455543745;
    local_158[1] = 3.3887808219431252;
    local_158[2] = 4.665255136408125;
    local_158[3] = 1.5;
    local_158[4] = 1.506900950283125;
    local_158[5] = 2.9628176357525002;
    local_158[6] = 5.2821630604062495;
    local_158[7] = 7.4795990834;
    local_158[8] = 3.1861205355625004;
    local_108[0] = 0.00049010354654;
    local_108[1] = 0.000340356715215;
    local_108[2] = 0.0011616005819375;
    local_108[3] = 0.0;
    local_108[4] = -1.20361935e-05;
    local_108[5] = 0.00046729736768999996;
    local_108[6] = 0.0009643321552500001;
    local_108[7] = 0.0013043066091500003;
    local_108[8] = 0.00037292866150000014;
    pdVar8 = local_78;
    local_78[0] = 1.9113420244977917;
    local_78[1] = 2.254512984911125;
    local_78[2] = -16.528347679998124;
    local_78[3] = 18.481084666666668;
    local_78[4] = 21.009669090999374;
    local_78[5] = 4.94295186894925;
    local_78[6] = 4.3818731557687505;
    local_78[7] = -6.101694818407498;
    local_78[8] = 2.079423216195834;
  }
  else {
    local_158[0] = 3.8916149455543745;
    local_158[1] = 4.388780821943126;
    local_158[2] = 5.665255136408124;
    local_158[3] = 2.5;
    local_158[4] = 2.506900950283125;
    local_158[5] = 3.9628176357525002;
    local_158[6] = 6.28216306040625;
    local_158[7] = 8.4795990834;
    local_158[8] = 4.1861205355625;
    local_108[0] = 0.00049010354654;
    local_108[1] = 0.000340356715215;
    local_108[2] = 0.0011616005819375;
    local_108[3] = 0.0;
    local_108[4] = -1.20361935e-05;
    local_108[5] = 0.00046729736768999996;
    local_108[6] = 0.0009643321552500001;
    local_108[7] = 0.0013043066091500003;
    local_108[8] = 0.00037292866150000014;
    pdVar8 = &local_5a8;
  }
  dVar25 = 0.0;
  dVar38 = 0.0;
  dVar23 = 0.0;
  lVar7 = 0;
  dVar22 = 0.0;
  do {
    dVar15 = *(double *)((long)adStack_690 + lVar7 + 8);
    dVar22 = dVar22 + *(double *)((long)local_158 + lVar7) * dVar15;
    dVar13 = *(double *)((long)pdVar8 + lVar7);
    dVar25 = dVar25 + dVar15 * *(double *)((long)local_108 + lVar7);
    dVar38 = dVar38 + *(double *)((long)local_708 + lVar7) * dVar13;
    dVar23 = dVar23 + (*(double *)((long)local_158 + lVar7) - dVar13) * 0.0006666666666666666 *
                      *(double *)((long)local_708 + lVar7) +
                      dVar13 * *(double *)((long)adStack_470 + lVar7 + 0x288);
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x48);
  dVar38 = dVar38 * (1.0 / dVar22);
  dVar15 = (1.0 / dVar22) * 1500.0;
  dVar22 = dVar38 * dVar15;
  dVar15 = -dVar15;
  pdVar9 = &local_4b8;
  lVar7 = 0;
  do {
    dVar13 = 0.0;
    lVar10 = 0;
    do {
      dVar13 = dVar13 + pdVar8[lVar10] * pdVar9[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 9);
    adStack_470[lVar7 * 10] = local_158[lVar7] * dVar22 + dVar13 * dVar15;
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 10;
  } while (lVar7 != 9);
  local_1a0 = dVar15 * dVar23 + (dVar22 * dVar25 - dVar38);
  if (base == 1) {
    *rowPtr = 1;
    iVar6 = 1;
    pdVar8 = &local_4b8;
    lVar7 = 0;
    lVar10 = 0;
    do {
      lVar10 = lVar10 + 1;
      lVar11 = 0;
      iVar12 = 1;
      do {
        if (lVar7 == lVar11) {
          colVals[(long)iVar6 + -1] = (int)lVar10;
LAB_0013dd66:
          iVar6 = iVar6 + 1;
        }
        else if ((*(double *)((long)pdVar8 + lVar11) != 0.0) ||
                (NAN(*(double *)((long)pdVar8 + lVar11)))) {
          colVals[(long)iVar6 + -1] = iVar12;
          goto LAB_0013dd66;
        }
        iVar12 = iVar12 + 1;
        lVar11 = lVar11 + 0x50;
      } while (lVar11 != 800);
      rowPtr[lVar10] = iVar6;
      lVar7 = lVar7 + 0x50;
      pdVar8 = pdVar8 + 1;
    } while (lVar10 != 10);
  }
  else {
    *rowPtr = 0;
    lVar7 = 0;
    pdVar8 = &local_4b8;
    iVar6 = 0;
    do {
      lVar10 = 0;
      pdVar9 = pdVar8;
      do {
        if (lVar7 == lVar10) {
          colVals[iVar6] = (int)lVar7;
LAB_0013ddc7:
          iVar6 = iVar6 + 1;
        }
        else if ((*pdVar9 != 0.0) || (NAN(*pdVar9))) {
          colVals[iVar6] = (int)lVar10;
          goto LAB_0013ddc7;
        }
        lVar10 = lVar10 + 1;
        pdVar9 = pdVar9 + 10;
      } while (lVar10 != 10);
      rowPtr[lVar7 + 1] = iVar6;
      lVar7 = lVar7 + 1;
      pdVar8 = pdVar8 + 1;
    } while (lVar7 != 10);
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(
  int* colVals, int* rowPtr, const int* consP, int base)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian_precond(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtr[0] = 1;
    int nJdata_tmp = 1;
    for (int l = 0; l < 10; l++) {
      for (int k = 0; k < 10; k++) {
        if (k == l) {
          colVals[nJdata_tmp - 1] = l + 1;
          nJdata_tmp = nJdata_tmp + 1;
        } else {
          if (Jac[10 * k + l] != 0.0) {
            colVals[nJdata_tmp - 1] = k + 1;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
      }
      rowPtr[l + 1] = nJdata_tmp;
    }
  } else {
    rowPtr[0] = 0;
    int nJdata_tmp = 0;
    for (int l = 0; l < 10; l++) {
      for (int k = 0; k < 10; k++) {
        if (k == l) {
          colVals[nJdata_tmp] = l;
          nJdata_tmp = nJdata_tmp + 1;
        } else {
          if (Jac[10 * k + l] != 0.0) {
            colVals[nJdata_tmp] = k;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
      }
      rowPtr[l + 1] = nJdata_tmp;
    }
  }
}